

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall asl::Console::color(Console *this,Color color)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = (color & (BLACK|YELLOW)) - RED;
  if ((uVar1 < 8) && ((0xf7U >> (uVar1 & 0x1f) & 1) != 0)) {
    pcVar3 = &DAT_001420e8 + *(int *)(&DAT_001420e8 + (ulong)uVar1 * 4);
  }
  else {
    pcVar2 = "1";
    if ((color & BRIGHT) == COLOR_DEFAULT) {
      pcVar2 = "0";
    }
    pcVar3 = "37";
    if ((color & (BLACK|YELLOW)) != WHITE) {
      pcVar3 = pcVar2;
    }
  }
  pcVar2 = "\x1b[1m";
  if ((color & BRIGHT) == COLOR_DEFAULT) {
    pcVar2 = "\x1b[22m";
  }
  printf(pcVar2);
  printf("\x1b[%sm",pcVar3);
  this->_colorChanged = true;
  return;
}

Assistant:

void Console::color(Color color)
{
	bool bright = (color & BRIGHT);
	color = (Color)(color & 0x0f);
	const char* attr =
		color==BLACK? "30":
		color==RED? "31":
		color==GREEN? "32":
		color==YELLOW? "33":
		color==BLUE? "34":
		color==MAGENTA? "35":
		color==CYAN? "36":
		color==WHITE? "37":
		bright? "1":
		"0";
	if(bright)
		printf("\033[1m");
	else
		printf("\033[22m");
	printf("\033[%sm", attr);
	_colorChanged = true;
}